

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_10::toLower
                  (int32_t caseLocale,uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,
                  UCaseContext *csc,int32_t srcStart,int32_t srcLimit,Edits *edits,
                  UErrorCode *errorCode)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  UChar *local_78;
  UChar *s;
  ushort local_66;
  UChar32 c;
  ushort local_60;
  UChar trail;
  int32_t cpStart;
  uint16_t props;
  UChar UStack_56;
  int8_t d;
  int32_t delta;
  int32_t iStack_50;
  UChar lead;
  int32_t srcIndex;
  int32_t prev;
  int32_t destIndex;
  UTrie2 *trie;
  int8_t *latinToLower;
  UCaseContext *csc_local;
  UChar *src_local;
  UChar *pUStack_20;
  int32_t destCapacity_local;
  UChar *dest_local;
  int32_t local_10;
  uint32_t options_local;
  int32_t caseLocale_local;
  
  if (caseLocale != 1) {
    if (caseLocale < 0) {
      if ((options & 7) != 0) goto LAB_003a2cb0;
    }
    else if ((caseLocale == 2) || (caseLocale == 3)) {
LAB_003a2cb0:
      trie = (UTrie2 *)LatinCase::TO_LOWER_TR_LT;
      goto LAB_003a2cbb;
    }
  }
  trie = (UTrie2 *)LatinCase::TO_LOWER_NORMAL;
LAB_003a2cbb:
  latinToLower = (int8_t *)csc;
  csc_local = (UCaseContext *)src;
  src_local._4_4_ = destCapacity;
  pUStack_20 = dest;
  dest_local._4_4_ = options;
  local_10 = caseLocale;
  _prev = ucase_getTrie_63();
  srcIndex = 0;
  iStack_50 = srcStart;
  delta = srcStart;
  do {
    UStack_56 = L'\0';
    iVar2 = delta;
LAB_003a2cdd:
    while (delta = iVar2, iVar1 = delta, delta < srcLimit) {
      UStack_56 = *(UChar *)((long)&csc_local->p + (long)delta * 2);
      if (0x17e < (ushort)UStack_56) {
        if (((ushort)UStack_56 < 0xd800) &&
           (local_60 = _prev->index
                       [(int)((uint)_prev->index[(int)(uint)(ushort)UStack_56 >> 5] * 4 +
                             ((ushort)UStack_56 & 0x1f))], (local_60 & 8) == 0)) goto LAB_003a2d97;
        break;
      }
      trail._1_1_ = *(char *)((long)&trie->index + (ulong)(ushort)UStack_56);
      if (trail._1_1_ == -0x80) break;
      iVar2 = delta + 1;
      if (trail._1_1_ != '\0') {
        cpStart = (int32_t)trail._1_1_;
        goto LAB_003a2dc4;
      }
    }
    if (srcLimit <= delta) {
      iVar2 = appendUnchanged(pUStack_20,srcIndex,src_local._4_4_,
                              (UChar *)((long)&csc_local->p + (long)iStack_50 * 2),delta - iStack_50
                              ,dest_local._4_4_,edits);
      if (-1 < iVar2) {
        return iVar2;
      }
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    iVar3 = delta + 1;
    c = delta;
    if ((((UStack_56 & 0xfc00U) == 0xd800) && (iVar3 < srcLimit)) &&
       (local_66 = *(ushort *)((long)&csc_local->p + (long)iVar3 * 2), (local_66 & 0xfc00) == 0xdc00
       )) {
      s._4_4_ = (uint)(ushort)UStack_56 * 0x400 + (uint)local_66 + 0xfca02400;
      delta = delta + 2;
    }
    else {
      s._4_4_ = (uint)(ushort)UStack_56;
      delta = iVar3;
    }
    if (local_10 < 0) {
      s._4_4_ = ucase_toFullFolding_63(s._4_4_,&local_78,dest_local._4_4_);
    }
    else {
      *(int32_t *)(latinToLower + 0x14) = iVar1;
      *(int32_t *)(latinToLower + 0x18) = delta;
      s._4_4_ = ucase_toFullLower_63
                          (s._4_4_,utf16_caseContextIterator,latinToLower,&local_78,local_10);
    }
    if (-1 < (int)s._4_4_) {
      srcIndex = appendUnchanged(pUStack_20,srcIndex,src_local._4_4_,
                                 (UChar *)((long)&csc_local->p + (long)iStack_50 * 2),c - iStack_50,
                                 dest_local._4_4_,edits);
      if (-1 < srcIndex) {
        srcIndex = appendResult(pUStack_20,srcIndex,src_local._4_4_,s._4_4_,local_78,delta - c,
                                dest_local._4_4_,edits);
      }
      if (srcIndex < 0) {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
      iStack_50 = delta;
    }
  } while( true );
LAB_003a2d97:
  iVar2 = delta + 1;
  if (((local_60 & 2) != 0) && (cpStart = (int)(short)local_60 >> 7, cpStart != 0)) {
LAB_003a2dc4:
    delta = delta + 1;
    UStack_56 = UStack_56 + (short)cpStart;
    srcIndex = appendUnchanged(pUStack_20,srcIndex,src_local._4_4_,
                               (UChar *)((long)&csc_local->p + (long)iStack_50 * 2),
                               iVar1 - iStack_50,dest_local._4_4_,edits);
    if ((-1 < srcIndex) &&
       (srcIndex = appendUChar(pUStack_20,srcIndex,src_local._4_4_,UStack_56), edits != (Edits *)0x0
       )) {
      Edits::addReplace(edits,1,1);
    }
    if (srcIndex < 0) {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    iStack_50 = delta;
    iVar2 = delta;
  }
  goto LAB_003a2cdd;
}

Assistant:

int32_t toLower(int32_t caseLocale, uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, UCaseContext *csc, int32_t srcStart, int32_t srcLimit,
                icu::Edits *edits, UErrorCode &errorCode) {
    const int8_t *latinToLower;
    if (caseLocale == UCASE_LOC_ROOT ||
            (caseLocale >= 0 ?
                !(caseLocale == UCASE_LOC_TURKISH || caseLocale == UCASE_LOC_LITHUANIAN) :
                (options & _FOLD_CASE_OPTIONS_MASK) == U_FOLD_CASE_DEFAULT)) {
        latinToLower = LatinCase::TO_LOWER_NORMAL;
    } else {
        latinToLower = LatinCase::TO_LOWER_TR_LT;
    }
    const UTrie2 *trie = ucase_getTrie();
    int32_t destIndex = 0;
    int32_t prev = srcStart;
    int32_t srcIndex = srcStart;
    for (;;) {
        // fast path for simple cases
        UChar lead = 0;
        while (srcIndex < srcLimit) {
            lead = src[srcIndex];
            int32_t delta;
            if (lead < LatinCase::LONG_S) {
                int8_t d = latinToLower[lead];
                if (d == LatinCase::EXC) { break; }
                ++srcIndex;
                if (d == 0) { continue; }
                delta = d;
            } else if (lead >= 0xd800) {
                break;  // surrogate or higher
            } else {
                uint16_t props = UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, lead);
                if (UCASE_HAS_EXCEPTION(props)) { break; }
                ++srcIndex;
                if (!UCASE_IS_UPPER_OR_TITLE(props) || (delta = UCASE_GET_DELTA(props)) == 0) {
                    continue;
                }
            }
            lead += static_cast<UChar>(delta);
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, srcIndex - 1 - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendUChar(dest, destIndex, destCapacity, lead);
                if (edits != nullptr) {
                    edits->addReplace(1, 1);
                }
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
        if (srcIndex >= srcLimit) {
            break;
        }
        // slow path
        int32_t cpStart = srcIndex++;
        UChar trail;
        UChar32 c;
        if (U16_IS_LEAD(lead) && srcIndex < srcLimit && U16_IS_TRAIL(trail = src[srcIndex])) {
            c = U16_GET_SUPPLEMENTARY(lead, trail);
            ++srcIndex;
        } else {
            c = lead;
        }
        const UChar *s;
        if (caseLocale >= 0) {
            csc->cpStart = cpStart;
            csc->cpLimit = srcIndex;
            c = ucase_toFullLower(c, utf16_caseContextIterator, csc, &s, caseLocale);
        } else {
            c = ucase_toFullFolding(c, &s, options);
        }
        if (c >= 0) {
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, cpStart - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                         srcIndex - cpStart, options, edits);
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
    }
    destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                src + prev, srcIndex - prev, options, edits);
    if (destIndex < 0) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    return destIndex;
}